

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.cpp
# Opt level: O0

ptr __thiscall
chatter::Peer::ack_packet(Peer *this,ProtocolChannelID channel_id,SeqNum sequence_num)

{
  bool bVar1;
  reference psVar2;
  _List_node_base **this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined7 in_register_00000031;
  long lVar4;
  ptr pVar5;
  const_iterator local_78;
  _Self local_70 [3];
  SeqNum *local_58;
  _List_node_base *local_50;
  _List_iterator<std::shared_ptr<chatter::Packet>_> local_48;
  _List_node_base *local_40;
  _List_iterator<std::shared_ptr<chatter::Packet>_> local_38;
  iterator itr;
  ProtocolChannel *chan;
  undefined1 local_20 [7];
  byte local_19;
  SeqNum sequence_num_local;
  ProtocolChannelID channel_id_local;
  Peer *this_local;
  ptr *packet;
  
  lVar4 = CONCAT71(in_register_00000031,channel_id);
  local_19 = (byte)sequence_num;
  _sequence_num_local = lVar4;
  this_local = this;
  if (local_19 < 0x21) {
    std::shared_ptr<chatter::Packet>::shared_ptr((shared_ptr<chatter::Packet> *)this,(nullptr_t)0x0)
    ;
    itr._M_node = (_List_node_base *)(lVar4 + 0x48 + (ulong)local_19 * 0x20);
    std::_List_iterator<std::shared_ptr<chatter::Packet>_>::_List_iterator(&local_38);
    local_48._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>
         ::begin((list<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>
                  *)&(itr._M_node)->_M_prev);
    local_50 = (_List_node_base *)
               std::__cxx11::
               list<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>
               ::end((list<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>
                      *)&(itr._M_node)->_M_prev);
    local_58 = (SeqNum *)local_20;
    local_40 = (_List_node_base *)
               std::
               find_if<std::_List_iterator<std::shared_ptr<chatter::Packet>>,chatter::Peer::ack_packet(unsigned_char,unsigned_int)::__0>
                         (local_48,(_List_iterator<std::shared_ptr<chatter::Packet>_>)local_50,
                          (anon_class_8_1_50b5e806_for__M_pred)local_58);
    local_38 = (_List_iterator<std::shared_ptr<chatter::Packet>_>)local_40;
    local_70[0]._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>
         ::end((list<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>
                *)&(itr._M_node)->_M_prev);
    bVar1 = std::operator!=(&local_38,local_70);
    _Var3._M_pi = extraout_RDX_00;
    if (bVar1) {
      psVar2 = std::_List_iterator<std::shared_ptr<chatter::Packet>_>::operator*(&local_38);
      std::shared_ptr<chatter::Packet>::operator=((shared_ptr<chatter::Packet> *)this,psVar2);
      this_00 = &(itr._M_node)->_M_prev;
      std::_List_const_iterator<std::shared_ptr<chatter::Packet>_>::_List_const_iterator
                (&local_78,&local_38);
      std::__cxx11::
      list<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>::
      erase((list<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>
             *)this_00,local_78);
      _Var3._M_pi = extraout_RDX_01;
    }
  }
  else {
    std::shared_ptr<chatter::Packet>::shared_ptr((shared_ptr<chatter::Packet> *)this,(nullptr_t)0x0)
    ;
    _Var3._M_pi = extraout_RDX;
  }
  pVar5.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  pVar5.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr)pVar5.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Packet::ptr Peer::ack_packet(ProtocolChannelID channel_id, SeqNum sequence_num)
{
    /* 0 -> 31 are ordered channels, 32 is used for unordered reliable */
    if (channel_id > 32)
        return nullptr;

    Packet::ptr packet = nullptr;
    ProtocolChannel& chan = m_channels[channel_id];

    std::list<Packet::ptr>::iterator itr;
    itr = std::find_if(
            chan.sent_reliable.begin(),
            chan.sent_reliable.end(),
            [&](Packet::ptr p){return p->m_sequence_num == sequence_num;}
        );

    if (itr != chan.sent_reliable.end()) {
        /* Found the packet! */
        packet = *itr;
        chan.sent_reliable.erase(itr);
    }

    return packet;
}